

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

lyd_node * lyd_child_no_keys(lyd_node *node)

{
  lyd_node **pplVar1;
  bool bVar2;
  lyd_node *local_28;
  lyd_node *child;
  lyd_node **children;
  lyd_node *node_local;
  
  if (node == (lyd_node *)0x0) {
    node_local = (lyd_node *)0x0;
  }
  else if (node->schema == (lysc_node *)0x0) {
    node_local = *(lyd_node **)(node + 1);
  }
  else {
    pplVar1 = lyd_node_child_p(node);
    if (pplVar1 == (lyd_node **)0x0) {
      node_local = (lyd_node *)0x0;
    }
    else {
      local_28 = *pplVar1;
      while( true ) {
        bVar2 = false;
        if ((local_28 != (lyd_node *)0x0) && (bVar2 = false, local_28->schema != (lysc_node *)0x0))
        {
          bVar2 = (local_28->schema->flags & 0x100) != 0;
        }
        if (!bVar2) break;
        local_28 = local_28->next;
      }
      node_local = local_28;
    }
  }
  return node_local;
}

Assistant:

lyd_node *
lyd_child_no_keys(const struct lyd_node *node)
{
    struct lyd_node **children;

    if (!node) {
        return NULL;
    }

    if (!node->schema) {
        /* opaq node */
        return ((struct lyd_node_opaq *)node)->child;
    }

    children = lyd_node_child_p((struct lyd_node *)node);
    if (children) {
        struct lyd_node *child = *children;

        while (child && child->schema && (child->schema->flags & LYS_KEY)) {
            child = child->next;
        }
        return child;
    } else {
        return NULL;
    }
}